

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

int __thiscall SimpleLogger::start(SimpleLogger *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_40 [32];
  atomic<SimpleLoggerMgr_*> this_00;
  
  if ((this->filePath)._M_string_length != 0) {
    getLogFilePath_abi_cxx11_((string *)local_40,this,this->curRevnum);
    std::ofstream::open((string *)&this->fs,(_Ios_Openmode)(string *)local_40);
    if ((EVP_PKEY_CTX *)local_40._0_8_ != (EVP_PKEY_CTX *)(local_40 + 0x10)) {
      operator_delete((void *)local_40._0_8_);
    }
    if (((&this->field_0x58)[*(long *)(*(long *)&this->fs + -0x18)] & 5) != 0) {
      return -1;
    }
    this_00._M_b._M_p = SimpleLoggerMgr::instance._M_b._M_p;
    if (SimpleLoggerMgr::instance._M_b._M_p == (__pointer_type)0x0) {
      iVar1 = SimpleLoggerMgr::init((EVP_PKEY_CTX *)local_40._0_8_);
      this_00._M_b._M_p = (__base_type)CONCAT44(extraout_var,iVar1);
    }
    SimpleLoggerMgr::addLogger((SimpleLoggerMgr *)this_00._M_b._M_p,this);
    if (-1 < (this->curLogLevel).super___atomic_base<int>._M_i) {
      put(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/examples/logger.cc"
          ,"start",0x3d6,"Start logger: %s (%zu MB per file, up to %zu files)",
          (this->filePath)._M_dataplus._M_p,this->maxLogFileSize >> 0x14,
          (this->maxLogFiles).super___atomic_base<unsigned_long>._M_i);
    }
    if ((((__pointer_type)this_00._M_b._M_p)->globalCriticalInfo)._M_string_length != 0) {
      if ((this->curLogLevel).super___atomic_base<int>._M_i < 4) {
        return 0;
      }
      put(this,4,
          "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/examples/logger.cc"
          ,"start",0x3da,"%s",
          (((__pointer_type)this_00._M_b._M_p)->globalCriticalInfo)._M_dataplus._M_p);
      return 0;
    }
  }
  return 0;
}

Assistant:

void SimpleLogger::setMaxLogFiles(size_t max_log_files) {
    if (max_log_files == 0) return;

    maxLogFiles = max_log_files;
}